

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O3

map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
* __thiscall
Pda::initMap(map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
             *__return_storage_ptr__,Pda *this,Node *n)

{
  _Rb_tree_header *p_Var1;
  pointer ppTVar2;
  char cVar3;
  undefined8 in_RAX;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *pvVar4;
  mapped_type *pmVar5;
  Transition **f;
  pointer ppTVar6;
  undefined8 uStack_28;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  uStack_28 = in_RAX;
  pvVar4 = Tjen::Node::getTransitions(n);
  ppTVar6 = (pvVar4->
            super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (pvVar4->
            super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar6 != ppTVar2) {
    do {
      cVar3 = Tjen::Node::Transition::getInput(*ppTVar6);
      uStack_28 = CONCAT17(cVar3,(undefined7)uStack_28);
      pmVar5 = std::
               map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)((long)&uStack_28 + 7));
      *pmVar5 = *pmVar5 + 1;
      ppTVar6 = ppTVar6 + 1;
    } while (ppTVar6 != ppTVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<const char, unsigned int> Pda::initMap(Tjen::Node *n) {
    std::map<const char, unsigned int> m;
    for (auto &f: n->getTransitions()) {
        m[f->getInput()] ++;
    }
    return m;
}